

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O2

void __thiscall
VertexClustering::calcCurvature
          (VertexClustering *this,vector<VCFace_*,_std::allocator<VCFace_*>_> *faces)

{
  double *pdVar1;
  pointer ppVVar2;
  VCFace *f;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined8 uVar8;
  clock_t cVar9;
  long lVar10;
  _Base_ptr p_Var11;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pCVar12;
  clock_t cVar13;
  pointer ppVVar14;
  VertexClustering *this_00;
  _Elt_pointer *s;
  VertexClustering *this_01;
  ulong uVar15;
  long lVar16;
  double dVar17;
  undefined1 auVar18 [16];
  int local_3a8;
  int local_3a4;
  ulong local_388;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  pts;
  undefined1 local_368 [16];
  pointer local_358;
  pointer local_350;
  pointer ppVStack_348;
  double local_340;
  double local_338;
  _Base_ptr local_328;
  _Base_ptr p_Stack_320;
  double local_318;
  Vector2d eValues;
  _Elt_pointer local_2d8;
  _Elt_pointer local_2d0;
  _Map_pointer local_2c8;
  Scalar local_2c0;
  Scalar local_2b8;
  double local_2b0;
  Scalar local_2a8;
  Scalar local_2a0;
  Vector3d D1;
  Vector3d D2;
  Matrix2d eVecs;
  set<int,_std::less<int>,_std::allocator<int>_> rings;
  Vector3d origin;
  vector<double,_std::allocator<double>_> poly;
  undefined1 local_1a8 [16];
  Nested local_198;
  double dStack_190;
  Matrix3d Rotation;
  Matrix3d Stretch;
  Matrix3d o2w;
  Matrix3d w2o;
  
  printf("start to calculate curvature for %lu faces...\n",
         (long)(faces->super__Vector_base<VCFace_*,_std::allocator<VCFace_*>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(faces->super__Vector_base<VCFace_*,_std::allocator<VCFace_*>_>)._M_impl.
               super__Vector_impl_data._M_start >> 3);
  cVar9 = clock();
  ppVVar14 = (faces->super__Vector_base<VCFace_*,_std::allocator<VCFace_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  ppVVar2 = (faces->super__Vector_base<VCFace_*,_std::allocator<VCFace_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  local_388 = (ulong)((long)ppVVar2 - (long)ppVVar14 >> 3) / 10;
  local_3a8 = 1;
  local_3a4 = 0;
  while( true ) {
    if (ppVVar14 == ppVVar2) break;
    f = *ppVVar14;
    collectRings(&rings,this,f);
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::vector(&pts,rings._M_t._M_impl.super__Rb_tree_header._M_node_count,(allocator_type *)local_368
            );
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    lazyAssign<Eigen::Matrix<double,3,1,0,3,1>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&origin,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&f->center);
    lVar16 = 0;
    p_Var11 = rings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while ((_Rb_tree_header *)p_Var11 != &rings._M_t._M_impl.super__Rb_tree_header) {
      lVar10 = (long)(int)p_Var11[1]._M_color * 0x50;
      local_358 = (pointer)(*(double *)(&this->vGroup->field_0x18 + lVar10) -
                           origin.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                           m_storage.m_data.array[2]);
      pdVar1 = (double *)(&this->vGroup->field_0x8 + lVar10);
      dVar17 = pdVar1[1] -
               origin.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
               array[1];
      local_368._8_4_ = SUB84(dVar17,0);
      local_368._0_8_ =
           *pdVar1 - origin.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                     m_data.array[0];
      local_368._12_4_ = (int)((ulong)dVar17 >> 0x20);
      Eigen::DenseBase<Eigen::Matrix<double,3,1,0,3,1>>::swap<Eigen::Matrix<double,3,1,0,3,1>>
                ((DenseBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_368,
                 (PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                 ((long)((pts.
                          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                        m_data.array + lVar16));
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
      lVar16 = lVar16 + 0x18;
    }
    make_coord_space(&o2w,&f->normal);
    local_368._0_8_ = &o2w;
    this_00 = (VertexClustering *)local_368;
    Eigen::DenseBase<Eigen::Matrix<double,3,3,0,3,3>>::
    lazyAssign<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>
              ((DenseBase<Eigen::Matrix<double,3,3,0,3,3>> *)&w2o,
               (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)local_368);
    lVar16 = 0;
    uVar15 = 0;
    while( true ) {
      if ((ulong)(((long)pts.
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)pts.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar15) break;
      local_368._8_8_ =
           (long)((pts.
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
                 array + lVar16;
      local_368._0_8_ = (DenseBase<Eigen::Matrix<double,3,3,0,3,3>> *)&w2o;
      this_00 = (VertexClustering *)local_368;
      Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
      _set<Eigen::CoeffBasedProduct<Eigen::Matrix<double,3,3,0,3,3>const&,Eigen::Matrix<double,3,1,0,3,1>const&,6>>
                ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_368._8_8_,
                 (DenseBase<Eigen::CoeffBasedProduct<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_&,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_6>_>
                  *)local_368);
      uVar15 = uVar15 + 1;
      lVar16 = lVar16 + 0x18;
    }
    this_01 = (VertexClustering *)&poly;
    leastSquareFitting(&poly,this_00,&pts);
    dVar17 = localCurvature(this_01,&poly,&eValues,&eVecs);
    f->area = dVar17 * f->area;
    if ((this->opts).anisotropic == true) {
      Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
      BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                      local_1a8,&o2w,0);
      uVar8 = local_1a8._0_8_;
      dVar17 = eVecs.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
               array[0];
      Stretch.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]
           = (double)local_198;
      Stretch.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2]
           = dStack_190;
      Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
      BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                      &Rotation,&o2w,1);
      local_368._8_8_ = uVar8;
      local_350 = (pointer)Stretch.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[1];
      ppVStack_348 = (pointer)Stretch.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                              m_storage.m_data.array[2];
      local_340 = dVar17;
      local_338 = Rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[0];
      local_328 = (_Base_ptr)
                  Rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[2];
      p_Stack_320 = (_Base_ptr)
                    Rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                    m_data.array[3];
      local_318 = eVecs.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                  m_data.array[1];
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>_>_>
      ::normalized(&D1,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>_>_>
                        *)local_368);
      Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
      BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                      local_1a8,&o2w,0);
      uVar8 = local_1a8._0_8_;
      dVar17 = eVecs.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
               array[2];
      Stretch.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]
           = (double)local_198;
      Stretch.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2]
           = dStack_190;
      Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
      BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                      &Rotation,&o2w,1);
      local_368._8_8_ = uVar8;
      local_350 = (pointer)Stretch.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[1];
      ppVStack_348 = (pointer)Stretch.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                              m_storage.m_data.array[2];
      local_340 = dVar17;
      local_338 = Rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[0];
      local_328 = (_Base_ptr)
                  Rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[2];
      p_Stack_320 = (_Base_ptr)
                    Rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                    m_data.array[3];
      local_318 = eVecs.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                  m_data.array[3];
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>_>_>
      ::normalized(&D2,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>_>_>
                        *)local_368);
      Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
      BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                      local_368,&Rotation,0);
      *(double *)local_368._0_8_ =
           D1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
      ;
      *(double *)(local_368._0_8_ + 8) =
           D1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
      ;
      *(double *)(local_368._0_8_ + 0x10) =
           D1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
      ;
      Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
      BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                      local_368,&Rotation,1);
      dVar7 = D2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
              [2];
      dVar6 = D2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
              [1];
      dVar5 = D2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
              [0];
      dVar4 = D1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
              [2];
      dVar3 = D1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
              [1];
      dVar17 = D1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
               array[0];
      *(double *)local_368._0_8_ =
           D2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
      ;
      *(double *)(local_368._0_8_ + 8) =
           D2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
      ;
      *(double *)(local_368._0_8_ + 0x10) =
           D2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
      ;
      Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
      BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                      local_368,&Rotation,2);
      *(double *)local_368._0_8_ = dVar7 * dVar3 - dVar6 * dVar4;
      *(double *)(local_368._0_8_ + 8) = dVar5 * dVar4 - dVar7 * dVar17;
      *(double *)(local_368._0_8_ + 0x10) = dVar17 * dVar6 - dVar5 * dVar3;
      local_368._8_8_ = 0;
      local_368._0_8_ = &Stretch;
      Stretch.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
           = ABS(eValues.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
                 m_data.array[0]);
      local_358 = (pointer)0x1;
      local_350 = (pointer)0x1;
      local_1a8._0_8_ = (pointer)0x0;
      pCVar12 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                          ((CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_368,
                           (Scalar *)local_1a8);
      local_2a0 = 0.0;
      pCVar12 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                          (pCVar12,&local_2a0);
      local_2a8 = 0.0;
      pCVar12 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                          (pCVar12,&local_2a8);
      local_2b0 = ABS(eValues.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage
                      .m_data.array[1]);
      pCVar12 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                          (pCVar12,&local_2b0);
      local_2b8 = 0.0;
      pCVar12 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                          (pCVar12,&local_2b8);
      local_2c0 = 0.0;
      pCVar12 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                          (pCVar12,&local_2c0);
      local_2c8 = (_Map_pointer)0x0;
      pCVar12 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                          (pCVar12,(Scalar *)&local_2c8);
      local_2d0 = (_Elt_pointer)
                  ABS(eValues.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage
                      .m_data.array[0]);
      local_2d8 = (_Elt_pointer)
                  ABS(eValues.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage
                      .m_data.array[1]);
      s = &local_2d0;
      if ((double)local_2d0 < (double)local_2d8) {
        s = &local_2d8;
      }
      Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar12,(Scalar *)s)
      ;
      Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::~CommaInitializer
                ((CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_368);
      local_1a8._8_8_ = &Stretch;
      local_1a8._0_8_ = (VertexGroup *)&Rotation;
      local_368._0_8_ =
           Eigen::CoeffBasedProduct::operator_cast_to_Matrix_((CoeffBasedProduct *)local_1a8);
      local_368._8_8_ = (VertexGroup *)&Rotation;
      Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
      _set<Eigen::CoeffBasedProduct<Eigen::Matrix<double,3,3,0,3,3>const&,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const,6>>
                ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&f->K,
                 (DenseBase<Eigen::CoeffBasedProduct<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_&,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_6>_>
                  *)local_368);
    }
    if ((int)local_388 <= local_3a4) {
      printf("%%%d...\n",(ulong)(uint)(local_3a8 * 10));
      lVar16 = (long)(faces->super__Vector_base<VCFace_*,_std::allocator<VCFace_*>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(faces->super__Vector_base<VCFace_*,_std::allocator<VCFace_*>_>)._M_impl.
                     super__Vector_impl_data._M_start;
      lVar10 = lVar16 >> 3;
      auVar18._8_4_ = (int)(lVar16 >> 0x23);
      auVar18._0_8_ = lVar10;
      auVar18._12_4_ = 0x45300000;
      local_3a8 = local_3a8 + 1;
      local_388 = (ulong)(uint)(int)((double)local_3a8 *
                                    (((auVar18._8_8_ - 1.9342813113834067e+25) +
                                     ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0)
                                     ) / 10.0));
    }
    local_3a4 = local_3a4 + 1;
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&poly.super__Vector_base<double,_std::allocator<double>_>);
    std::
    _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::~_Vector_base(&pts.
                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   );
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&rings._M_t);
    ppVVar14 = ppVVar14 + 1;
  }
  cVar13 = clock();
  printf("Done, uses %lf s for curvature.\n",(double)(cVar13 - cVar9) / 1000000.0);
  return;
}

Assistant:

void VertexClustering::calcCurvature(vector<VCFace*> & faces)
{
	printf("start to calculate curvature for %lu faces...\n", faces.size());
	clock_t start = clock();
	int cnt = 0, n10 = faces.size() / 10, percent = 1;
	for (VCFace* f : faces) {
		set<int> rings(collectRings(f));
		vector<Vector3d> pts(rings.size());
		int i = 0;
		Vector3d origin = f->center;
		for (int id : rings)
			pts[i++] = vGroup->group[id].pos - origin;
		Matrix3d o2w;
		make_coord_space(o2w, f->normal);
		Matrix3d w2o = o2w.transpose();
		for (i = 0; i < pts.size(); i++) {
			pts[i] = w2o * pts[i]; //now pts are in object coordinate
		}
		vector<double> poly(leastSquareFitting(pts));
		Matrix2d eVecs;
		Vector2d eValues;
		double weight = localCurvature(poly, eValues, eVecs);
		f->area *= weight;       //update density based on curvature
		if (opts.anisotropic) {  
			//D1, D2 are the priciple directions in xyz coordinate, their eigenvalues are principle curvatures
			Vector3d D1 = (o2w.col(0) * eVecs(0, 0) + o2w.col(1) * eVecs(1, 0)).normalized();
			Vector3d D2 = (o2w.col(0) * eVecs(0, 1) + o2w.col(1) * eVecs(1, 1)).normalized();
			Matrix3d Rotation;
			Rotation.col(0) = D1;
			Rotation.col(1) = D2;
			Rotation.col(2) = D1.cross(D2);
			Matrix3d Stretch;
			Stretch << fabs(eValues(0)), 0, 0,
				0, fabs(eValues(1)), 0,
				0, 0, max(fabs(eValues(0)), fabs(eValues(1)));
			f->K = Rotation * Stretch * Rotation.transpose(); //compute the Riemannian metric
		}
		if (++cnt > n10) {
			printf("%%%d...\n", 10 * percent);
			n10 = faces.size() / 10.0 * ++percent;
		}
	}
	printf("Done, uses %lf s for curvature.\n", (double)(clock() - start) / CLOCKS_PER_SEC);
}